

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O3

void conv_fmt_8bit_c(uchar *src_y,uchar *src_uv,uchar **dst,int width,int height,int src_stride,
                    int src_stridec,int *dst_stride,int uv_shift)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  uchar *puVar5;
  long lVar6;
  uchar *puVar7;
  
  if (0 < height) {
    puVar7 = *dst;
    iVar1 = height;
    do {
      memcpy(puVar7,src_y,(long)width);
      src_y = src_y + src_stride;
      puVar7 = puVar7 + *dst_stride;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  uVar2 = width >> ((byte)uv_shift & 0x1f);
  iVar1 = height >> ((byte)uv_shift & 0x1f);
  if (0 < iVar1) {
    puVar7 = dst[1];
    iVar3 = 0;
    puVar4 = src_uv;
    do {
      if (0 < (int)uVar2) {
        lVar6 = 0;
        puVar5 = puVar7;
        do {
          *puVar5 = puVar4[(int)lVar6];
          lVar6 = lVar6 + 2;
          puVar5 = puVar5 + 1;
        } while ((ulong)uVar2 * 2 != lVar6);
      }
      puVar4 = puVar4 + src_stridec;
      puVar7 = puVar7 + dst_stride[1];
      iVar3 = iVar3 + 1;
    } while (iVar3 != iVar1);
    if (0 < iVar1) {
      puVar7 = dst[2];
      puVar4 = src_uv + 1;
      iVar3 = 0;
      do {
        if (0 < (int)uVar2) {
          lVar6 = 0;
          puVar5 = puVar7;
          do {
            *puVar5 = puVar4[(int)lVar6];
            lVar6 = lVar6 + 2;
            puVar5 = puVar5 + 1;
          } while ((ulong)uVar2 * 2 != lVar6);
        }
        puVar4 = puVar4 + src_stridec;
        puVar7 = puVar7 + dst_stride[2];
        iVar3 = iVar3 + 1;
      } while (iVar3 != iVar1);
    }
  }
  return;
}

Assistant:

static void conv_fmt_8bit_c(unsigned char* src_y, unsigned char* src_uv, unsigned char* dst[3], int width, int height, int src_stride, int src_stridec, int dst_stride[3], int uv_shift) {
    int i, j;
    unsigned char* psrc = src_y;
    unsigned char* pdst = dst[0];
    for (i = 0; i < height; i++) {
        memcpy(pdst, psrc, width);
        psrc += src_stride;
        pdst += dst_stride[0];
    }

    width >>= uv_shift;
    height >>= uv_shift;

    psrc = src_uv;
    pdst = dst[1];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = psrc[j << 1];
        }
        psrc += src_stridec;
        pdst += dst_stride[1];
    }

    psrc = src_uv + 1;
    pdst = dst[2];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = psrc[j << 1];
        }
        psrc += src_stridec;
        pdst += dst_stride[2];
    }
}